

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

Vec_Vec_t * Vec_VecStart(int nSize)

{
  Vec_Vec_t *pVVar1;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  pVVar1 = (Vec_Vec_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < nSize - 1U) {
    iVar4 = nSize;
  }
  pVVar1->nCap = iVar4;
  uVar5 = 0;
  if (iVar4 == 0) {
    ppvVar2 = (void **)0x0;
  }
  else {
    ppvVar2 = (void **)malloc((long)iVar4 << 3);
  }
  pVVar1->pArray = ppvVar2;
  uVar6 = 0;
  if (0 < nSize) {
    uVar6 = (ulong)(uint)nSize;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pVVar3 = Vec_PtrAlloc(0);
    ppvVar2[uVar5] = pVVar3;
  }
  pVVar1->nSize = nSize;
  return pVVar1;
}

Assistant:

static inline Vec_Vec_t * Vec_VecStart( int nSize )
{
    Vec_Vec_t * p;
    int i;
    p = Vec_VecAlloc( nSize );
    for ( i = 0; i < nSize; i++ )
        p->pArray[i] = Vec_PtrAlloc( 0 );
    p->nSize = nSize;
    return p;
}